

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O2

void aom_lpf_horizontal_14_sse2(uchar *s,int p,uchar *_blimit,uchar *_limit,uchar *_thresh)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  byte bVar12;
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  byte bVar67;
  byte bVar68;
  byte bVar69;
  byte bVar70;
  byte bVar71;
  byte bVar72;
  byte bVar73;
  byte bVar74;
  undefined1 auVar75 [15];
  unkuint9 Var76;
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  unkuint9 Var79;
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  unkuint9 Var82;
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  unkuint9 Var85;
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [11];
  undefined1 auVar89 [15];
  undefined1 auVar90 [11];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  ulong uVar102;
  long lVar103;
  byte bVar104;
  byte bVar107;
  byte bVar109;
  short sVar111;
  short sVar112;
  char cVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  short sVar119;
  char cVar121;
  short sVar122;
  short sVar123;
  short sVar124;
  short sVar125;
  byte bVar127;
  short sVar128;
  byte bVar130;
  short sVar131;
  short sVar133;
  undefined1 auVar105 [16];
  char cVar108;
  char cVar110;
  byte bVar113;
  char cVar114;
  char cVar120;
  char cVar126;
  byte bVar129;
  byte bVar132;
  undefined1 auVar106 [16];
  undefined1 auVar134 [16];
  ulong uVar135;
  undefined1 auVar136 [16];
  undefined1 auVar145 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  short sVar158;
  short sVar159;
  undefined4 uVar160;
  short sVar161;
  ushort uVar162;
  short sVar163;
  short sVar164;
  short sVar165;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar166 [16];
  short sVar167;
  ushort uVar168;
  short sVar171;
  short sVar172;
  short sVar173;
  short sVar174;
  short sVar175;
  short sVar176;
  undefined1 auVar169 [16];
  ushort uVar177;
  undefined1 auVar178 [16];
  short sVar179;
  short sVar180;
  short sVar181;
  short sVar182;
  short sVar183;
  short sVar184;
  short sVar185;
  short sVar186;
  short sVar187;
  short sVar188;
  ushort uVar189;
  short sVar190;
  ushort uVar191;
  short sVar192;
  short sVar193;
  ushort uVar194;
  short sVar195;
  short sVar196;
  ushort uVar197;
  short sVar198;
  short sVar199;
  ushort uVar200;
  short sVar201;
  short sVar202;
  ushort uVar203;
  ushort uVar204;
  short sVar205;
  short sVar206;
  ushort uVar207;
  ushort uVar208;
  short sVar209;
  short sVar210;
  ushort uVar211;
  ushort uVar212;
  short sVar213;
  short sVar214;
  ushort uVar215;
  ushort uVar216;
  ushort uVar217;
  short sVar220;
  short sVar221;
  short sVar222;
  ushort uVar223;
  short sVar224;
  ushort uVar225;
  short sVar226;
  short sVar227;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  ushort uVar228;
  ulong uVar229;
  undefined1 auVar230 [16];
  short sVar231;
  short sVar232;
  short sVar233;
  uint uVar234;
  short sVar237;
  short sVar238;
  short sVar239;
  short sVar240;
  short sVar241;
  short sVar242;
  short sVar243;
  short sVar244;
  short sVar245;
  short sVar246;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  byte bVar247;
  byte bVar248;
  short sVar249;
  undefined4 uVar250;
  short sVar255;
  undefined4 uVar264;
  short sVar268;
  short sVar269;
  ulong uVar251;
  byte bVar253;
  byte bVar254;
  short sVar256;
  byte bVar257;
  byte bVar258;
  byte bVar259;
  byte bVar260;
  byte bVar261;
  short sVar262;
  short sVar263;
  byte bVar265;
  byte bVar266;
  byte bVar267;
  short sVar270;
  byte bVar271;
  byte bVar272;
  short sVar273;
  byte bVar274;
  byte bVar275;
  short sVar276;
  byte bVar277;
  byte bVar278;
  byte bVar279;
  short sVar280;
  byte bVar281;
  byte bVar282;
  byte bVar283;
  byte bVar284;
  byte bVar285;
  byte bVar286;
  undefined1 auVar252 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  short sVar290;
  short sVar291;
  byte bVar292;
  short sVar293;
  byte bVar294;
  byte bVar296;
  short sVar295;
  byte bVar297;
  byte bVar299;
  short sVar298;
  byte bVar300;
  byte bVar302;
  short sVar301;
  byte bVar303;
  byte bVar305;
  short sVar304;
  byte bVar306;
  byte bVar308;
  short sVar307;
  undefined1 local_128 [16];
  ulong local_118;
  undefined1 local_108 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar146 [16];
  undefined1 auVar149 [16];
  undefined1 uVar150;
  undefined1 uVar151;
  undefined1 uVar152;
  undefined1 uVar153;
  undefined1 uVar154;
  undefined1 uVar155;
  undefined1 auVar170 [16];
  
  lVar103 = (long)p;
  uVar1 = *(undefined4 *)(s + lVar103 * -5);
  uVar2 = *(undefined4 *)(s + lVar103 * -4);
  uVar3 = *(undefined4 *)(s + lVar103 * 3);
  auVar166._0_8_ = CONCAT44(uVar3,uVar2);
  auVar166._8_8_ = 0;
  uVar4 = *(undefined4 *)(s + lVar103 * -3);
  uVar5 = *(undefined4 *)(s + lVar103 * 2);
  auVar134._0_8_ = CONCAT44(uVar5,uVar4);
  auVar134._8_8_ = 0;
  uVar6 = *(undefined4 *)(s + lVar103 * -2);
  uVar7 = *(undefined4 *)(s + -lVar103);
  uVar8 = *(undefined4 *)(s + lVar103 * -6);
  uVar9 = *(undefined4 *)(s + lVar103);
  auVar235._0_8_ = CONCAT44(uVar9,uVar6);
  auVar235._8_8_ = 0;
  uVar10 = *(undefined4 *)s;
  auVar230._0_8_ = CONCAT44(uVar10,uVar7);
  auVar230._8_8_ = 0;
  auVar170._8_4_ = uVar10;
  auVar170._0_8_ = auVar230._0_8_;
  auVar170._12_4_ = uVar9;
  auVar169._8_8_ = auVar170._8_8_;
  auVar169._4_4_ = uVar6;
  auVar169._0_4_ = uVar7;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = auVar169._8_8_;
  auVar105 = psubusb(auVar169,auVar178);
  auVar156 = psubusb(auVar178,auVar169);
  auVar156 = auVar156 | auVar105;
  auVar157 = paddusb(auVar156,auVar156);
  auVar105._0_2_ = auVar156._4_2_ >> 1;
  auVar105._2_2_ = auVar156._6_2_ >> 1;
  auVar105._4_2_ = auVar156._8_2_ >> 1;
  auVar105._6_2_ = auVar156._10_2_ >> 1;
  auVar105._8_2_ = auVar156._12_2_ >> 1;
  auVar105._10_2_ = auVar156._14_2_ >> 1;
  auVar105._12_4_ = 0;
  auVar105 = paddusb(auVar105 & _DAT_00423fd0,auVar157);
  auVar105 = psubusb(auVar105,*(undefined1 (*) [16])_blimit);
  bVar67 = *_thresh;
  bVar68 = _thresh[1];
  bVar69 = _thresh[2];
  bVar70 = _thresh[3];
  bVar71 = _thresh[4];
  bVar72 = _thresh[5];
  bVar73 = _thresh[6];
  bVar74 = _thresh[7];
  auVar156 = psubusb(auVar235,auVar230);
  auVar157 = psubusb(auVar230,auVar235);
  auVar157 = auVar157 | auVar156;
  bVar279 = -(auVar105[0] == '\0') ^ 0xff;
  bVar282 = -(auVar105[1] == '\0') ^ 0xff;
  bVar284 = -(auVar105[2] == '\0') ^ 0xff;
  bVar286 = -(auVar105[3] == '\0') ^ 0xff;
  bVar258 = -(auVar105[4] == '\0') ^ 0xff;
  bVar261 = -(auVar105[5] == '\0') ^ 0xff;
  bVar266 = -(auVar105[6] == '\0') ^ 0xff;
  bVar248 = -(auVar105[7] == '\0') ^ 0xff;
  bVar292 = auVar157[0];
  bVar104 = (bVar279 < bVar292) * bVar292 | (bVar279 >= bVar292) * bVar279;
  bVar294 = auVar157[1];
  bVar107 = (bVar282 < bVar294) * bVar294 | (bVar282 >= bVar294) * bVar282;
  bVar296 = auVar157[2];
  bVar109 = (bVar284 < bVar296) * bVar296 | (bVar284 >= bVar296) * bVar284;
  bVar297 = auVar157[3];
  bVar113 = (bVar286 < bVar297) * bVar297 | (bVar286 >= bVar297) * bVar286;
  bVar299 = auVar157[4];
  bVar260 = (bVar299 != 0) * bVar299;
  bVar300 = auVar157[5];
  bVar279 = (bVar300 != 0) * bVar300;
  bVar302 = auVar157[6];
  bVar282 = (bVar302 != 0) * bVar302;
  bVar303 = auVar157[7];
  bVar284 = (bVar303 != 0) * bVar303;
  bVar305 = auVar157[8];
  bVar127 = (bVar258 < bVar305) * bVar305 | (bVar258 >= bVar305) * bVar258;
  bVar306 = auVar157[9];
  bVar129 = (bVar261 < bVar306) * bVar306 | (bVar261 >= bVar306) * bVar261;
  bVar308 = auVar157[10];
  bVar130 = (bVar266 < bVar308) * bVar308 | (bVar266 >= bVar308) * bVar266;
  bVar12 = auVar157[0xb];
  bVar132 = (bVar248 < bVar12) * bVar12 | (bVar248 >= bVar12) * bVar248;
  bVar286 = (auVar157[0xc] != '\0') * auVar157[0xc];
  bVar258 = (auVar157[0xd] != '\0') * auVar157[0xd];
  bVar261 = (auVar157[0xe] != '\0') * auVar157[0xe];
  bVar266 = (auVar157[0xf] != '\0') * auVar157[0xf];
  auVar105 = psubusb(auVar134,auVar235);
  auVar156 = psubusb(auVar235,auVar134);
  auVar156 = auVar156 | auVar105;
  auVar105 = psubusb(auVar166,auVar134);
  auVar157 = psubusb(auVar134,auVar166);
  auVar157 = auVar157 | auVar105;
  bVar248 = auVar156[0];
  bVar247 = auVar157[0];
  bVar247 = (bVar247 < bVar248) * bVar248 | (bVar247 >= bVar248) * bVar247;
  bVar248 = auVar156[1];
  bVar253 = auVar157[1];
  bVar253 = (bVar253 < bVar248) * bVar248 | (bVar253 >= bVar248) * bVar253;
  bVar248 = auVar156[2];
  bVar254 = auVar157[2];
  bVar254 = (bVar254 < bVar248) * bVar248 | (bVar254 >= bVar248) * bVar254;
  bVar248 = auVar156[3];
  bVar257 = auVar157[3];
  bVar257 = (bVar257 < bVar248) * bVar248 | (bVar257 >= bVar248) * bVar257;
  bVar248 = auVar156[4];
  bVar259 = auVar157[4];
  bVar259 = (bVar259 < bVar248) * bVar248 | (bVar259 >= bVar248) * bVar259;
  bVar248 = auVar156[5];
  bVar265 = auVar157[5];
  bVar265 = (bVar265 < bVar248) * bVar248 | (bVar265 >= bVar248) * bVar265;
  bVar248 = auVar156[6];
  bVar267 = auVar157[6];
  bVar267 = (bVar267 < bVar248) * bVar248 | (bVar267 >= bVar248) * bVar267;
  bVar248 = auVar156[7];
  bVar271 = auVar157[7];
  bVar271 = (bVar271 < bVar248) * bVar248 | (bVar271 >= bVar248) * bVar271;
  bVar248 = auVar156[8];
  bVar272 = auVar157[8];
  bVar272 = (bVar272 < bVar248) * bVar248 | (bVar272 >= bVar248) * bVar272;
  bVar248 = auVar156[9];
  bVar274 = auVar157[9];
  bVar274 = (bVar274 < bVar248) * bVar248 | (bVar274 >= bVar248) * bVar274;
  bVar248 = auVar156[10];
  bVar275 = auVar157[10];
  bVar275 = (bVar275 < bVar248) * bVar248 | (bVar275 >= bVar248) * bVar275;
  bVar248 = auVar156[0xb];
  bVar277 = auVar157[0xb];
  bVar277 = (bVar277 < bVar248) * bVar248 | (bVar277 >= bVar248) * bVar277;
  bVar248 = auVar156[0xc];
  bVar278 = auVar157[0xc];
  bVar278 = (bVar278 < bVar248) * bVar248 | (bVar278 >= bVar248) * bVar278;
  bVar248 = auVar156[0xd];
  bVar281 = auVar157[0xd];
  bVar281 = (bVar281 < bVar248) * bVar248 | (bVar281 >= bVar248) * bVar281;
  bVar248 = auVar156[0xe];
  bVar283 = auVar157[0xe];
  bVar285 = auVar157[0xf];
  bVar283 = (bVar283 < bVar248) * bVar248 | (bVar283 >= bVar248) * bVar283;
  bVar248 = auVar156[0xf];
  bVar285 = (bVar285 < bVar248) * bVar248 | (bVar285 >= bVar248) * bVar285;
  bVar248 = (bVar247 < bVar104) * bVar104 | (bVar247 >= bVar104) * bVar247;
  bVar104 = (bVar253 < bVar107) * bVar107 | (bVar253 >= bVar107) * bVar253;
  bVar107 = (bVar254 < bVar109) * bVar109 | (bVar254 >= bVar109) * bVar254;
  bVar109 = (bVar257 < bVar113) * bVar113 | (bVar257 >= bVar113) * bVar257;
  bVar260 = (bVar259 < bVar260) * bVar260 | (bVar259 >= bVar260) * bVar259;
  bVar113 = (bVar265 < bVar279) * bVar279 | (bVar265 >= bVar279) * bVar265;
  bVar247 = (bVar267 < bVar282) * bVar282 | (bVar267 >= bVar282) * bVar267;
  bVar253 = (bVar271 < bVar284) * bVar284 | (bVar271 >= bVar284) * bVar271;
  bVar127 = (bVar272 < bVar127) * bVar127 | (bVar272 >= bVar127) * bVar272;
  bVar129 = (bVar274 < bVar129) * bVar129 | (bVar274 >= bVar129) * bVar274;
  bVar130 = (bVar275 < bVar130) * bVar130 | (bVar275 >= bVar130) * bVar275;
  bVar132 = (bVar277 < bVar132) * bVar132 | (bVar277 >= bVar132) * bVar277;
  bVar279 = (bVar278 < bVar286) * bVar286 | (bVar278 >= bVar286) * bVar278;
  bVar282 = (bVar281 < bVar258) * bVar258 | (bVar281 >= bVar258) * bVar281;
  bVar284 = (bVar283 < bVar261) * bVar261 | (bVar283 >= bVar261) * bVar283;
  bVar286 = (bVar285 < bVar266) * bVar266 | (bVar285 >= bVar266) * bVar285;
  bVar257 = (bVar260 < bVar248) * bVar248 | (bVar260 >= bVar248) * bVar260;
  bVar259 = (bVar113 < bVar104) * bVar104 | (bVar113 >= bVar104) * bVar113;
  bVar265 = (bVar247 < bVar107) * bVar107 | (bVar247 >= bVar107) * bVar247;
  bVar267 = (bVar253 < bVar109) * bVar109 | (bVar253 >= bVar109) * bVar253;
  bVar271 = (bVar127 < bVar260) * bVar260 | (bVar127 >= bVar260) * bVar127;
  bVar272 = (bVar129 < bVar113) * bVar113 | (bVar129 >= bVar113) * bVar129;
  bVar274 = (bVar130 < bVar247) * bVar247 | (bVar130 >= bVar247) * bVar130;
  bVar275 = (bVar132 < bVar253) * bVar253 | (bVar132 >= bVar253) * bVar132;
  bVar277 = (bVar279 < bVar127) * bVar127 | (bVar279 >= bVar127) * bVar279;
  bVar278 = (bVar282 < bVar129) * bVar129 | (bVar282 >= bVar129) * bVar282;
  bVar281 = (bVar284 < bVar130) * bVar130 | (bVar284 >= bVar130) * bVar284;
  bVar283 = (bVar286 < bVar132) * bVar132 | (bVar286 >= bVar132) * bVar286;
  bVar279 = (bVar279 != 0) * bVar279;
  bVar282 = (bVar282 != 0) * bVar282;
  bVar284 = (bVar284 != 0) * bVar284;
  bVar286 = (bVar286 != 0) * bVar286;
  bVar258 = *_limit;
  bVar261 = _limit[1];
  bVar266 = _limit[2];
  bVar260 = _limit[3];
  bVar248 = _limit[4];
  bVar104 = _limit[5];
  bVar107 = _limit[6];
  bVar109 = _limit[7];
  bVar113 = _limit[8];
  bVar127 = _limit[9];
  bVar129 = _limit[10];
  bVar130 = _limit[0xb];
  bVar132 = _limit[0xc];
  bVar247 = _limit[0xd];
  bVar253 = _limit[0xe];
  bVar254 = _limit[0xf];
  auVar218._0_4_ =
       CONCAT13(-((byte)((bVar267 < bVar260) * bVar267 | (bVar267 >= bVar260) * bVar260) == bVar267)
                ,CONCAT12(-((byte)((bVar265 < bVar266) * bVar265 | (bVar265 >= bVar266) * bVar266)
                           == bVar265),
                          CONCAT11(-((byte)((bVar259 < bVar261) * bVar259 |
                                           (bVar259 >= bVar261) * bVar261) == bVar259),
                                   -((byte)((bVar257 < bVar258) * bVar257 |
                                           (bVar257 >= bVar258) * bVar258) == bVar257))));
  auVar218[4] = -((byte)((bVar271 < bVar248) * bVar271 | (bVar271 >= bVar248) * bVar248) == bVar271)
  ;
  auVar218[5] = -((byte)((bVar272 < bVar104) * bVar272 | (bVar272 >= bVar104) * bVar104) == bVar272)
  ;
  auVar218[6] = -((byte)((bVar274 < bVar107) * bVar274 | (bVar274 >= bVar107) * bVar107) == bVar274)
  ;
  auVar218[7] = -((byte)((bVar275 < bVar109) * bVar275 | (bVar275 >= bVar109) * bVar109) == bVar275)
  ;
  auVar218[8] = -((byte)((bVar277 < bVar113) * bVar277 | (bVar277 >= bVar113) * bVar113) == bVar277)
  ;
  auVar218[9] = -((byte)((bVar278 < bVar127) * bVar278 | (bVar278 >= bVar127) * bVar127) == bVar278)
  ;
  auVar218[10] = -((byte)((bVar281 < bVar129) * bVar281 | (bVar281 >= bVar129) * bVar129) == bVar281
                  );
  auVar218[0xb] =
       -((byte)((bVar283 < bVar130) * bVar283 | (bVar283 >= bVar130) * bVar130) == bVar283);
  auVar218[0xc] =
       -((byte)((bVar279 < bVar132) * bVar279 | (bVar279 >= bVar132) * bVar132) == bVar279);
  auVar218[0xd] =
       -((byte)((bVar282 < bVar247) * bVar282 | (bVar282 >= bVar247) * bVar247) == bVar282);
  auVar218[0xe] =
       -((byte)((bVar284 < bVar253) * bVar284 | (bVar284 >= bVar253) * bVar253) == bVar284);
  auVar218[0xf] =
       -((byte)((bVar286 < bVar254) * bVar286 | (bVar286 >= bVar254) * bVar254) == bVar286);
  auVar105 = psubusb(auVar134,auVar230);
  auVar156 = psubusb(auVar230,auVar134);
  auVar156 = auVar156 | auVar105;
  auVar105 = psubusb(auVar166,auVar230);
  auVar157 = psubusb(auVar230,auVar166);
  auVar157 = auVar157 | auVar105;
  bVar279 = auVar156[0];
  bVar282 = auVar157[0];
  bVar282 = (bVar282 < bVar279) * bVar279 | (bVar282 >= bVar279) * bVar282;
  bVar279 = auVar156[1];
  bVar284 = auVar157[1];
  bVar284 = (bVar284 < bVar279) * bVar279 | (bVar284 >= bVar279) * bVar284;
  bVar279 = auVar156[2];
  bVar286 = auVar157[2];
  bVar286 = (bVar286 < bVar279) * bVar279 | (bVar286 >= bVar279) * bVar286;
  bVar279 = auVar156[3];
  bVar258 = auVar157[3];
  bVar258 = (bVar258 < bVar279) * bVar279 | (bVar258 >= bVar279) * bVar258;
  bVar279 = auVar156[4];
  bVar261 = auVar157[4];
  bVar261 = (bVar261 < bVar279) * bVar279 | (bVar261 >= bVar279) * bVar261;
  bVar279 = auVar156[5];
  bVar266 = auVar157[5];
  bVar266 = (bVar266 < bVar279) * bVar279 | (bVar266 >= bVar279) * bVar266;
  bVar279 = auVar156[6];
  bVar260 = auVar157[6];
  bVar260 = (bVar260 < bVar279) * bVar279 | (bVar260 >= bVar279) * bVar260;
  bVar279 = auVar156[7];
  bVar248 = auVar157[7];
  bVar248 = (bVar248 < bVar279) * bVar279 | (bVar248 >= bVar279) * bVar248;
  bVar279 = (bVar282 < bVar292) * bVar292 | (bVar282 >= bVar292) * bVar282;
  bVar282 = (bVar284 < bVar294) * bVar294 | (bVar284 >= bVar294) * bVar284;
  bVar284 = (bVar286 < bVar296) * bVar296 | (bVar286 >= bVar296) * bVar286;
  bVar286 = (bVar258 < bVar297) * bVar297 | (bVar258 >= bVar297) * bVar258;
  bVar258 = (bVar261 < bVar299) * bVar299 | (bVar261 >= bVar299) * bVar261;
  bVar261 = (bVar266 < bVar300) * bVar300 | (bVar266 >= bVar300) * bVar266;
  bVar266 = (bVar260 < bVar302) * bVar302 | (bVar260 >= bVar302) * bVar260;
  bVar260 = (bVar248 < bVar303) * bVar303 | (bVar248 >= bVar303) * bVar248;
  bVar279 = (bVar258 < bVar279) * bVar279 | (bVar258 >= bVar279) * bVar258;
  bVar282 = (bVar261 < bVar282) * bVar282 | (bVar261 >= bVar282) * bVar261;
  bVar284 = (bVar266 < bVar284) * bVar284 | (bVar266 >= bVar284) * bVar266;
  bVar286 = (bVar260 < bVar286) * bVar286 | (bVar260 >= bVar286) * bVar260;
  uVar234 = CONCAT13(-((byte)((bVar286 == 0) * bVar286 | bVar286 != 0) == bVar286),
                     CONCAT12(-((byte)((bVar284 == 0) * bVar284 | bVar284 != 0) == bVar284),
                              CONCAT11(-((byte)((bVar282 == 0) * bVar282 | bVar282 != 0) == bVar282)
                                       ,-((byte)((bVar279 == 0) * bVar279 | bVar279 != 0) == bVar279
                                         )))) & auVar218._0_4_;
  auVar236._0_8_ = CONCAT44(uVar234,uVar234);
  auVar236._8_4_ = uVar234;
  auVar236._12_4_ = uVar234;
  cVar108 = (char)uVar234;
  auVar156[0] = -(cVar108 == '\0');
  cVar110 = (char)(uVar234 >> 8);
  auVar156[1] = -(cVar110 == '\0');
  cVar114 = (char)(uVar234 >> 0x10);
  auVar156[2] = -(cVar114 == '\0');
  cVar115 = (char)(uVar234 >> 0x18);
  auVar156[3] = -(cVar115 == '\0');
  auVar156[4] = -(cVar108 == '\0');
  auVar156[5] = -(cVar110 == '\0');
  auVar156[6] = -(cVar114 == '\0');
  auVar156[7] = -(cVar115 == '\0');
  auVar156[8] = -(cVar108 == '\0');
  auVar156[9] = -(cVar110 == '\0');
  auVar156[10] = -(cVar114 == '\0');
  auVar156[0xb] = -(cVar115 == '\0');
  auVar156[0xc] = -(cVar108 == '\0');
  auVar156[0xd] = -(cVar110 == '\0');
  auVar156[0xe] = -(cVar114 == '\0');
  auVar156[0xf] = -(cVar115 == '\0');
  uVar11 = *(undefined4 *)(s + lVar103 * 4);
  auVar138._0_8_ = CONCAT44(uVar11,uVar1);
  local_128._8_8_ = 0;
  local_128._0_8_ = auVar138._0_8_;
  bVar279 = (bVar299 < bVar292) * bVar292 | (bVar299 >= bVar292) * bVar299;
  bVar282 = (bVar300 < bVar294) * bVar294 | (bVar300 >= bVar294) * bVar300;
  bVar284 = (bVar302 < bVar296) * bVar296 | (bVar302 >= bVar296) * bVar302;
  bVar286 = (bVar303 < bVar297) * bVar297 | (bVar303 >= bVar297) * bVar303;
  bVar258 = (bVar305 < bVar299) * bVar299 | (bVar305 >= bVar299) * bVar305;
  bVar261 = (bVar306 < bVar300) * bVar300 | (bVar306 >= bVar300) * bVar306;
  bVar266 = (bVar308 < bVar302) * bVar302 | (bVar308 >= bVar302) * bVar308;
  bVar260 = (bVar12 < bVar303) * bVar303 | (bVar12 >= bVar303) * bVar12;
  uVar234 = CONCAT13(-((byte)((bVar286 < bVar70) * bVar286 | (bVar286 >= bVar70) * bVar70) ==
                      bVar286),
                     CONCAT12(-((byte)((bVar284 < bVar69) * bVar284 | (bVar284 >= bVar69) * bVar69)
                               == bVar284),
                              CONCAT11(-((byte)((bVar282 < bVar68) * bVar282 |
                                               (bVar282 >= bVar68) * bVar68) == bVar282),
                                       -((byte)((bVar279 < bVar67) * bVar279 |
                                               (bVar279 >= bVar67) * bVar67) == bVar279))));
  auVar105 = psubsb(auVar169 ^ _DAT_004252c0,auVar178 ^ _DAT_004252c0);
  uVar160 = (undefined4)
            (CONCAT17(-((byte)((bVar260 < bVar74) * bVar260 | (bVar260 >= bVar74) * bVar74) ==
                       bVar260),
                      CONCAT16(-((byte)((bVar266 < bVar73) * bVar266 | (bVar266 >= bVar73) * bVar73)
                                == bVar266),
                               CONCAT15(-((byte)((bVar261 < bVar72) * bVar261 |
                                                (bVar261 >= bVar72) * bVar72) == bVar261),
                                        CONCAT14(-((byte)((bVar258 < bVar71) * bVar258 |
                                                         (bVar258 >= bVar71) * bVar71) == bVar258),
                                                 uVar234)))) >> 0x20);
  auVar252._4_4_ = uVar234;
  auVar252._0_4_ = uVar234;
  auVar252._8_4_ = uVar160;
  auVar252._12_4_ = uVar160;
  uVar160 = *(undefined4 *)(s + lVar103 * 5);
  auVar157 = psubsb(~auVar252 & auVar105 >> 0x20,auVar105);
  auVar157 = psubsb(auVar157,auVar105);
  auVar105 = psubsb(auVar157,auVar105);
  uVar250 = SUB164(auVar105 & auVar218,0);
  uVar264 = SUB164(auVar105 & auVar218,4);
  auVar157._4_4_ = uVar250;
  auVar157._0_4_ = uVar250;
  auVar157._8_4_ = uVar264;
  auVar157._12_4_ = uVar264;
  auVar105 = paddsb(auVar157,_DAT_00468470);
  auVar287._0_8_ = CONCAT44(uVar160,uVar8);
  auVar287._8_8_ = 0;
  uVar155 = (undefined1)((uint)uVar11 >> 0x18);
  auVar144._8_6_ = 0;
  auVar144._0_8_ = auVar138._0_8_;
  auVar144[0xe] = uVar155;
  auVar144[0xf] = auVar105[7];
  auVar143._14_2_ = auVar144._14_2_;
  auVar143._8_5_ = 0;
  auVar143._0_8_ = auVar138._0_8_;
  auVar143[0xd] = auVar105[6];
  uVar154 = (undefined1)((uint)uVar11 >> 0x10);
  auVar142._13_3_ = auVar143._13_3_;
  auVar142._8_4_ = 0;
  auVar142._0_8_ = auVar138._0_8_;
  auVar142[0xc] = uVar154;
  auVar141._12_4_ = auVar142._12_4_;
  auVar141._8_3_ = 0;
  auVar141._0_8_ = auVar138._0_8_;
  auVar141[0xb] = auVar105[5];
  uVar153 = (undefined1)((uint)uVar11 >> 8);
  auVar140._11_5_ = auVar141._11_5_;
  auVar140._8_2_ = 0;
  auVar140._0_8_ = auVar138._0_8_;
  auVar140[10] = uVar153;
  auVar139._10_6_ = auVar140._10_6_;
  auVar139[8] = 0;
  auVar139._0_8_ = auVar138._0_8_;
  auVar139[9] = auVar105[4];
  auVar138._9_7_ = auVar139._9_7_;
  auVar138[8] = (char)uVar11;
  auVar137._8_8_ = auVar138._8_8_;
  auVar137[7] = auVar105[3];
  uVar152 = (undefined1)((uint)uVar1 >> 0x18);
  auVar137[6] = uVar152;
  auVar137[5] = auVar105[2];
  uVar151 = (undefined1)((uint)uVar1 >> 0x10);
  auVar137[4] = uVar151;
  auVar137._0_4_ = uVar1;
  auVar136._4_12_ = auVar137._4_12_;
  auVar136[3] = auVar105[1];
  uVar150 = (undefined1)((uint)uVar1 >> 8);
  auVar136[2] = uVar150;
  auVar136[0] = (undefined1)uVar1;
  auVar136[1] = auVar105[0];
  auVar105 = psraw(auVar136,0xb);
  auVar157 = packsswb(auVar105,auVar105);
  auVar106[0] = auVar157[0] + '\x01';
  cVar108 = auVar157[1] + '\x01';
  cVar110 = auVar157[2] + '\x01';
  cVar114 = auVar157[3] + '\x01';
  cVar115 = auVar157[4] + '\x01';
  cVar120 = auVar157[5] + '\x01';
  cVar121 = auVar157[6] + '\x01';
  cVar126 = auVar157[7] + '\x01';
  auVar106._8_8_ =
       (undefined8)
       (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(cVar126,cVar126),cVar121),
                                                     cVar121),cVar120),cVar120),cVar115),
                 CONCAT11(cVar115,cVar126)) >> 8);
  auVar106[7] = cVar114;
  auVar106[6] = cVar114;
  auVar106[5] = cVar110;
  auVar106[4] = cVar110;
  auVar106[3] = cVar108;
  auVar106[2] = cVar108;
  auVar106[1] = auVar106[0];
  auVar105 = psraw(auVar106,9);
  auVar105 = packsswb(auVar105,auVar105);
  uVar234 = auVar105._0_4_ & uVar234;
  auVar146._0_8_ = auVar157._0_8_;
  auVar146._8_4_ = auVar157._4_4_;
  auVar146._12_4_ = uVar234;
  auVar145._8_8_ = auVar146._8_8_;
  auVar145._0_4_ = auVar157._0_4_;
  auVar145._4_4_ = uVar234;
  auVar157 = psubsb(auVar178 ^ _DAT_004252c0,auVar145);
  auVar147._8_8_ = 0;
  auVar147._0_8_ = auVar145._8_8_;
  auVar105 = paddsb(auVar147,auVar169 ^ _DAT_004252c0);
  auVar149._0_8_ = auVar105._0_8_;
  auVar149._8_4_ = auVar105._4_4_;
  auVar149._12_4_ = auVar157._4_4_;
  auVar148._8_8_ = auVar149._8_8_;
  auVar148._0_4_ = auVar105._0_4_;
  auVar148._4_4_ = auVar157._0_4_;
  uVar135 = SUB168(auVar148 ^ _DAT_004252c0,0);
  uVar251 = SUB168(auVar148 ^ _DAT_004252c0,8);
  uVar102 = auVar138._0_8_;
  if ((ushort)((ushort)(SUB161(auVar156 >> 7,0) & 1) | (ushort)(SUB161(auVar156 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar156 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar156 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar156 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar156 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar156 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar156 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar156 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar156 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar156 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar156 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar156 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar156 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar156 >> 0x77,0) & 1) << 0xe | (ushort)(auVar156[0xf] >> 7) << 0xf
              ) != 0xffff) {
    uVar250 = *(undefined4 *)(s + -(long)(p * 7));
    uVar264 = *(undefined4 *)(s + lVar103 * 6);
    local_108._0_8_ = CONCAT44(uVar264,uVar250);
    local_108._8_8_ = 0;
    auVar13._8_6_ = 0;
    auVar13._0_8_ = auVar230._0_8_;
    auVar13[0xe] = (char)((uint)uVar10 >> 0x18);
    uVar216 = auVar13._13_2_;
    auVar20._8_4_ = 0;
    auVar20._0_8_ = auVar230._0_8_;
    auVar20[0xc] = (char)((uint)uVar10 >> 0x10);
    auVar20._13_2_ = uVar216;
    auVar27._8_4_ = 0;
    auVar27._0_8_ = auVar230._0_8_;
    auVar27._12_3_ = auVar20._12_3_;
    auVar34._8_2_ = 0;
    auVar34._0_8_ = auVar230._0_8_;
    auVar34[10] = (char)((uint)uVar10 >> 8);
    auVar34._11_4_ = auVar27._11_4_;
    auVar41._8_2_ = 0;
    auVar41._0_8_ = auVar230._0_8_;
    auVar41._10_5_ = auVar34._10_5_;
    auVar48[8] = (char)uVar10;
    auVar48._0_8_ = auVar230._0_8_;
    auVar48._9_6_ = auVar41._9_6_;
    auVar75._7_8_ = 0;
    auVar75._0_7_ = auVar48._8_7_;
    Var76 = CONCAT81(SUB158(auVar75 << 0x40,7),(char)((uint)uVar7 >> 0x18));
    auVar93._9_6_ = 0;
    auVar93._0_9_ = Var76;
    auVar55[4] = (char)((uint)uVar7 >> 0x10);
    auVar55._0_4_ = uVar7;
    auVar55._5_10_ = SUB1510(auVar93 << 0x30,5);
    auVar77._11_4_ = 0;
    auVar77._0_11_ = auVar55._4_11_;
    auVar60[2] = (char)((uint)uVar7 >> 8);
    auVar60._0_2_ = (ushort)uVar7;
    auVar60._3_12_ = SUB1512(auVar77 << 0x20,3);
    uVar204 = (ushort)uVar7 & 0xff;
    auVar14._8_6_ = 0;
    auVar14._0_8_ = auVar235._0_8_;
    auVar14[0xe] = (char)((uint)uVar9 >> 0x18);
    uVar162 = auVar14._13_2_;
    auVar21._8_4_ = 0;
    auVar21._0_8_ = auVar235._0_8_;
    auVar21[0xc] = (char)((uint)uVar9 >> 0x10);
    auVar21._13_2_ = uVar162;
    auVar28._8_4_ = 0;
    auVar28._0_8_ = auVar235._0_8_;
    auVar28._12_3_ = auVar21._12_3_;
    auVar35._8_2_ = 0;
    auVar35._0_8_ = auVar235._0_8_;
    auVar35[10] = (char)((uint)uVar9 >> 8);
    auVar35._11_4_ = auVar28._11_4_;
    auVar42._8_2_ = 0;
    auVar42._0_8_ = auVar235._0_8_;
    auVar42._10_5_ = auVar35._10_5_;
    auVar49[8] = (char)uVar9;
    auVar49._0_8_ = auVar235._0_8_;
    auVar49._9_6_ = auVar42._9_6_;
    auVar78._7_8_ = 0;
    auVar78._0_7_ = auVar49._8_7_;
    Var79 = CONCAT81(SUB158(auVar78 << 0x40,7),(char)((uint)uVar6 >> 0x18));
    auVar94._9_6_ = 0;
    auVar94._0_9_ = Var79;
    auVar56[4] = (char)((uint)uVar6 >> 0x10);
    auVar56._0_4_ = uVar6;
    auVar56._5_10_ = SUB1510(auVar94 << 0x30,5);
    auVar80._11_4_ = 0;
    auVar80._0_11_ = auVar56._4_11_;
    auVar61[2] = (char)((uint)uVar6 >> 8);
    auVar61._0_2_ = (ushort)uVar6;
    auVar61._3_12_ = SUB1512(auVar80 << 0x20,3);
    uVar177 = (ushort)uVar6 & 0xff;
    auVar15._8_6_ = 0;
    auVar15._0_8_ = auVar134._0_8_;
    auVar15[0xe] = (char)((uint)uVar5 >> 0x18);
    uVar168 = auVar15._13_2_;
    auVar22._8_4_ = 0;
    auVar22._0_8_ = auVar134._0_8_;
    auVar22[0xc] = (char)((uint)uVar5 >> 0x10);
    auVar22._13_2_ = uVar168;
    auVar29._8_4_ = 0;
    auVar29._0_8_ = auVar134._0_8_;
    auVar29._12_3_ = auVar22._12_3_;
    auVar36._8_2_ = 0;
    auVar36._0_8_ = auVar134._0_8_;
    auVar36[10] = (char)((uint)uVar5 >> 8);
    auVar36._11_4_ = auVar29._11_4_;
    auVar43._8_2_ = 0;
    auVar43._0_8_ = auVar134._0_8_;
    auVar43._10_5_ = auVar36._10_5_;
    auVar50[8] = (char)uVar5;
    auVar50._0_8_ = auVar134._0_8_;
    auVar50._9_6_ = auVar43._9_6_;
    auVar81._7_8_ = 0;
    auVar81._0_7_ = auVar50._8_7_;
    Var82 = CONCAT81(SUB158(auVar81 << 0x40,7),(char)((uint)uVar4 >> 0x18));
    auVar95._9_6_ = 0;
    auVar95._0_9_ = Var82;
    auVar57[4] = (char)((uint)uVar4 >> 0x10);
    auVar57._0_4_ = uVar4;
    auVar57._5_10_ = SUB1510(auVar95 << 0x30,5);
    auVar83._11_4_ = 0;
    auVar83._0_11_ = auVar57._4_11_;
    auVar62[2] = (char)((uint)uVar4 >> 8);
    auVar62._0_2_ = (ushort)uVar4;
    auVar62._3_12_ = SUB1512(auVar83 << 0x20,3);
    uVar225 = (ushort)uVar4 & 0xff;
    auVar16._8_6_ = 0;
    auVar16._0_8_ = auVar166._0_8_;
    auVar16[0xe] = (char)((uint)uVar3 >> 0x18);
    uVar189 = auVar16._13_2_;
    auVar23._8_4_ = 0;
    auVar23._0_8_ = auVar166._0_8_;
    auVar23[0xc] = (char)((uint)uVar3 >> 0x10);
    auVar23._13_2_ = uVar189;
    auVar30._8_4_ = 0;
    auVar30._0_8_ = auVar166._0_8_;
    auVar30._12_3_ = auVar23._12_3_;
    auVar37._8_2_ = 0;
    auVar37._0_8_ = auVar166._0_8_;
    auVar37[10] = (char)((uint)uVar3 >> 8);
    auVar37._11_4_ = auVar30._11_4_;
    auVar44._8_2_ = 0;
    auVar44._0_8_ = auVar166._0_8_;
    auVar44._10_5_ = auVar37._10_5_;
    auVar51[8] = (char)uVar3;
    auVar51._0_8_ = auVar166._0_8_;
    auVar51._9_6_ = auVar44._9_6_;
    auVar84._7_8_ = 0;
    auVar84._0_7_ = auVar51._8_7_;
    Var85 = CONCAT81(SUB158(auVar84 << 0x40,7),(char)((uint)uVar2 >> 0x18));
    auVar96._9_6_ = 0;
    auVar96._0_9_ = Var85;
    auVar58[4] = (char)((uint)uVar2 >> 0x10);
    auVar58._0_4_ = uVar2;
    auVar58._5_10_ = SUB1510(auVar96 << 0x30,5);
    auVar86._11_4_ = 0;
    auVar86._0_11_ = auVar58._4_11_;
    auVar63[2] = (char)((uint)uVar2 >> 8);
    auVar63._0_2_ = (ushort)uVar2;
    auVar63._3_12_ = SUB1512(auVar86 << 0x20,3);
    uVar223 = (ushort)uVar2 & 0xff;
    sVar180 = auVar62._2_2_;
    sVar192 = auVar61._2_2_;
    sVar182 = auVar57._4_2_;
    sVar195 = auVar56._4_2_;
    sVar184 = (short)Var82;
    sVar198 = (short)Var79;
    sVar186 = auVar50._8_2_;
    sVar201 = auVar49._8_2_;
    sVar187 = auVar36._10_2_;
    sVar205 = auVar35._10_2_;
    sVar188 = auVar22._12_2_;
    sVar209 = auVar21._12_2_;
    sVar213 = (uVar162 >> 8) + (uVar168 >> 8);
    sVar190 = uVar177 + uVar225 + uVar204;
    sVar111 = auVar60._2_2_;
    sVar193 = sVar192 + sVar180 + sVar111;
    sVar116 = auVar55._4_2_;
    sVar196 = sVar195 + sVar182 + sVar116;
    sVar122 = (short)Var76;
    sVar199 = sVar198 + sVar184 + sVar122;
    sVar128 = auVar48._8_2_;
    sVar202 = sVar201 + sVar186 + sVar128;
    sVar131 = auVar34._10_2_;
    sVar206 = sVar205 + sVar187 + sVar131;
    sVar133 = auVar20._12_2_;
    sVar210 = sVar209 + sVar188 + sVar133;
    sVar214 = sVar213 + (uVar216 >> 8);
    sVar249 = sVar202 + sVar190 + 4;
    sVar255 = sVar206 + sVar193 + 4;
    sVar262 = sVar210 + sVar196 + 4;
    sVar268 = sVar214 + sVar199 + 4;
    sVar171 = auVar63._2_2_;
    sVar172 = auVar58._4_2_;
    sVar173 = (short)Var85;
    sVar174 = auVar51._8_2_;
    sVar175 = auVar37._10_2_;
    sVar176 = auVar23._12_2_;
    sVar269 = sVar268 - (uVar168 >> 8);
    auVar105 = psubusb(local_128,auVar230);
    auVar156 = psubusb(auVar230,local_128);
    auVar156 = auVar156 | auVar105;
    auVar105 = psubusb(auVar287,auVar230);
    auVar157 = psubusb(auVar230,auVar287);
    auVar157 = auVar157 | auVar105;
    bVar279 = auVar156[0];
    bVar282 = auVar157[0];
    bVar282 = (bVar282 < bVar279) * bVar279 | (bVar282 >= bVar279) * bVar282;
    bVar279 = auVar156[1];
    bVar284 = auVar157[1];
    bVar284 = (bVar284 < bVar279) * bVar279 | (bVar284 >= bVar279) * bVar284;
    bVar279 = auVar156[2];
    bVar286 = auVar157[2];
    bVar286 = (bVar286 < bVar279) * bVar279 | (bVar286 >= bVar279) * bVar286;
    bVar279 = auVar156[3];
    bVar258 = auVar157[3];
    bVar260 = (bVar258 < bVar279) * bVar279 | (bVar258 >= bVar279) * bVar258;
    bVar279 = auVar156[4];
    bVar258 = auVar157[4];
    bVar292 = (bVar258 < bVar279) * bVar279 | (bVar258 >= bVar279) * bVar258;
    bVar279 = auVar156[5];
    bVar258 = auVar157[5];
    bVar248 = (bVar258 < bVar279) * bVar279 | (bVar258 >= bVar279) * bVar258;
    bVar279 = auVar156[6];
    bVar258 = auVar157[6];
    bVar294 = (bVar258 < bVar279) * bVar279 | (bVar258 >= bVar279) * bVar258;
    bVar279 = auVar156[7];
    bVar258 = auVar157[7];
    bVar296 = (bVar258 < bVar279) * bVar279 | (bVar258 >= bVar279) * bVar258;
    bVar279 = auVar156[8];
    bVar258 = auVar157[8];
    bVar297 = (bVar258 < bVar279) * bVar279 | (bVar258 >= bVar279) * bVar258;
    bVar279 = auVar156[9];
    bVar258 = auVar157[9];
    bVar299 = (bVar258 < bVar279) * bVar279 | (bVar258 >= bVar279) * bVar258;
    bVar279 = auVar156[10];
    bVar258 = auVar157[10];
    bVar300 = (bVar258 < bVar279) * bVar279 | (bVar258 >= bVar279) * bVar258;
    bVar279 = auVar156[0xb];
    bVar258 = auVar157[0xb];
    bVar302 = (bVar258 < bVar279) * bVar279 | (bVar258 >= bVar279) * bVar258;
    bVar279 = auVar156[0xc];
    bVar258 = auVar157[0xc];
    bVar303 = (bVar258 < bVar279) * bVar279 | (bVar258 >= bVar279) * bVar258;
    bVar279 = auVar156[0xd];
    bVar258 = auVar157[0xd];
    bVar305 = (bVar258 < bVar279) * bVar279 | (bVar258 >= bVar279) * bVar258;
    bVar279 = auVar156[0xe];
    bVar258 = auVar157[0xe];
    bVar261 = auVar157[0xf];
    bVar306 = (bVar258 < bVar279) * bVar279 | (bVar258 >= bVar279) * bVar258;
    bVar279 = auVar156[0xf];
    bVar308 = (bVar261 < bVar279) * bVar279 | (bVar261 >= bVar279) * bVar261;
    auVar105 = psubusb(local_108,auVar230);
    auVar156 = psubusb(auVar230,local_108);
    auVar156 = auVar156 | auVar105;
    bVar279 = auVar156[0];
    bVar258 = (bVar279 < bVar282) * bVar282 | (bVar279 >= bVar282) * bVar279;
    bVar279 = auVar156[1];
    bVar261 = (bVar279 < bVar284) * bVar284 | (bVar279 >= bVar284) * bVar279;
    bVar279 = auVar156[2];
    bVar266 = (bVar279 < bVar286) * bVar286 | (bVar279 >= bVar286) * bVar279;
    bVar279 = auVar156[3];
    bVar260 = (bVar279 < bVar260) * bVar260 | (bVar279 >= bVar260) * bVar279;
    bVar279 = auVar156[4];
    bVar292 = (bVar279 < bVar292) * bVar292 | (bVar279 >= bVar292) * bVar279;
    bVar279 = auVar156[5];
    bVar248 = (bVar279 < bVar248) * bVar248 | (bVar279 >= bVar248) * bVar279;
    bVar279 = auVar156[6];
    bVar294 = (bVar279 < bVar294) * bVar294 | (bVar279 >= bVar294) * bVar279;
    bVar279 = auVar156[7];
    bVar296 = (bVar279 < bVar296) * bVar296 | (bVar279 >= bVar296) * bVar279;
    bVar279 = auVar156[8];
    bVar297 = (bVar279 < bVar297) * bVar297 | (bVar279 >= bVar297) * bVar279;
    bVar279 = auVar156[9];
    bVar299 = (bVar279 < bVar299) * bVar299 | (bVar279 >= bVar299) * bVar279;
    bVar279 = auVar156[10];
    bVar300 = (bVar279 < bVar300) * bVar300 | (bVar279 >= bVar300) * bVar279;
    bVar279 = auVar156[0xb];
    bVar302 = (bVar279 < bVar302) * bVar302 | (bVar279 >= bVar302) * bVar279;
    bVar279 = auVar156[0xc];
    bVar286 = (bVar279 < bVar303) * bVar303 | (bVar279 >= bVar303) * bVar279;
    bVar279 = auVar156[0xd];
    bVar284 = (bVar279 < bVar305) * bVar305 | (bVar279 >= bVar305) * bVar279;
    bVar279 = auVar156[0xe];
    bVar303 = auVar156[0xf];
    bVar282 = (bVar279 < bVar306) * bVar306 | (bVar279 >= bVar306) * bVar279;
    bVar279 = (bVar303 < bVar308) * bVar308 | (bVar303 >= bVar308) * bVar303;
    bVar258 = (bVar292 < bVar258) * bVar258 | (bVar292 >= bVar258) * bVar292;
    bVar261 = (bVar248 < bVar261) * bVar261 | (bVar248 >= bVar261) * bVar248;
    bVar266 = (bVar294 < bVar266) * bVar266 | (bVar294 >= bVar266) * bVar294;
    bVar260 = (bVar296 < bVar260) * bVar260 | (bVar296 >= bVar260) * bVar296;
    bVar292 = (bVar297 < bVar292) * bVar292 | (bVar297 >= bVar292) * bVar297;
    bVar248 = (bVar299 < bVar248) * bVar248 | (bVar299 >= bVar248) * bVar299;
    bVar294 = (bVar300 < bVar294) * bVar294 | (bVar300 >= bVar294) * bVar300;
    bVar296 = (bVar302 < bVar296) * bVar296 | (bVar302 >= bVar296) * bVar302;
    bVar297 = (bVar286 < bVar297) * bVar297 | (bVar286 >= bVar297) * bVar286;
    bVar299 = (bVar284 < bVar299) * bVar299 | (bVar284 >= bVar299) * bVar284;
    bVar300 = (bVar282 < bVar300) * bVar300 | (bVar282 >= bVar300) * bVar282;
    bVar302 = (bVar279 < bVar302) * bVar302 | (bVar279 >= bVar302) * bVar279;
    bVar286 = (bVar286 != 0) * bVar286;
    bVar284 = (bVar284 != 0) * bVar284;
    bVar282 = (bVar282 != 0) * bVar282;
    bVar279 = (bVar279 != 0) * bVar279;
    auVar219[0] = -((byte)((bVar258 == 0) * bVar258 | bVar258 != 0) == bVar258);
    auVar219[1] = -((byte)((bVar261 == 0) * bVar261 | bVar261 != 0) == bVar261);
    auVar219[2] = -((byte)((bVar266 == 0) * bVar266 | bVar266 != 0) == bVar266);
    auVar219[3] = -((byte)((bVar260 == 0) * bVar260 | bVar260 != 0) == bVar260);
    auVar219[4] = -((byte)((bVar292 == 0) * bVar292 | bVar292 != 0) == bVar292);
    auVar219[5] = -((byte)((bVar248 == 0) * bVar248 | bVar248 != 0) == bVar248);
    auVar219[6] = -((byte)((bVar294 == 0) * bVar294 | bVar294 != 0) == bVar294);
    auVar219[7] = -((byte)((bVar296 == 0) * bVar296 | bVar296 != 0) == bVar296);
    auVar219[8] = -((byte)((bVar297 == 0) * bVar297 | bVar297 != 0) == bVar297);
    auVar219[9] = -((byte)((bVar299 == 0) * bVar299 | bVar299 != 0) == bVar299);
    auVar219[10] = -((byte)((bVar300 == 0) * bVar300 | bVar300 != 0) == bVar300);
    auVar219[0xb] = -((byte)((bVar302 == 0) * bVar302 | bVar302 != 0) == bVar302);
    auVar219[0xc] = -((byte)((bVar286 == 0) * bVar286 | bVar286 != 0) == bVar286);
    auVar219[0xd] = -((byte)((bVar284 == 0) * bVar284 | bVar284 != 0) == bVar284);
    auVar219[0xe] = -((byte)((bVar282 == 0) * bVar282 | bVar282 != 0) == bVar282);
    auVar219[0xf] = -((byte)((bVar279 == 0) * bVar279 | bVar279 != 0) == bVar279);
    uVar191 = (ushort)(uVar204 + uVar223 + sVar249) >> 3;
    uVar194 = (ushort)(sVar111 + sVar171 + sVar255) >> 3;
    uVar197 = (ushort)(sVar116 + sVar172 + sVar262) >> 3;
    uVar200 = (ushort)(sVar122 + sVar173 + sVar268) >> 3;
    uVar203 = (ushort)(sVar128 + sVar174 + sVar249) >> 3;
    uVar207 = (ushort)(sVar131 + sVar175 + sVar255) >> 3;
    uVar211 = (ushort)(sVar133 + sVar176 + sVar262) >> 3;
    uVar215 = (ushort)((uVar216 >> 8) + (uVar189 >> 8) + sVar268) >> 3;
    uVar135 = CONCAT17((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215),
                       CONCAT16((uVar211 != 0) * (uVar211 < 0x100) * (char)uVar211 -
                                (0xff < uVar211),
                                CONCAT15((uVar207 != 0) * (uVar207 < 0x100) * (char)uVar207 -
                                         (0xff < uVar207),
                                         CONCAT14((uVar203 != 0) * (uVar203 < 0x100) * (char)uVar203
                                                  - (0xff < uVar203),
                                                  CONCAT13((uVar200 != 0) * (uVar200 < 0x100) *
                                                           (char)uVar200 - (0xff < uVar200),
                                                           CONCAT12((uVar197 != 0) *
                                                                    (uVar197 < 0x100) *
                                                                    (char)uVar197 - (0xff < uVar197)
                                                                    ,CONCAT11((uVar194 != 0) *
                                                                              (uVar194 < 0x100) *
                                                                              (char)uVar194 -
                                                                              (0xff < uVar194),
                                                                              (uVar191 != 0) *
                                                                              (uVar191 < 0x100) *
                                                                              (char)uVar191 -
                                                                              (0xff < uVar191)))))))
                      ) & auVar236._0_8_ | ~auVar236._0_8_ & uVar135;
    uVar191 = (ushort)((sVar249 - sVar186) + uVar223 * 2 + uVar177) >> 3;
    uVar194 = (ushort)((sVar255 - sVar187) + sVar171 * 2 + sVar192) >> 3;
    uVar197 = (ushort)((sVar262 - sVar188) + sVar172 * 2 + sVar195) >> 3;
    uVar200 = (ushort)(sVar269 + sVar173 * 2 + sVar198) >> 3;
    uVar203 = (ushort)((sVar249 - uVar225) + sVar174 * 2 + sVar201) >> 3;
    uVar207 = (ushort)((sVar255 - sVar180) + sVar175 * 2 + sVar205) >> 3;
    uVar211 = (ushort)((sVar262 - sVar182) + sVar176 * 2 + sVar209) >> 3;
    uVar215 = (ushort)((sVar268 - sVar184) + (uVar189 >> 8) * 2 + (uVar162 >> 8)) >> 3;
    uVar251 = CONCAT17((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215),
                       CONCAT16((uVar211 != 0) * (uVar211 < 0x100) * (char)uVar211 -
                                (0xff < uVar211),
                                CONCAT15((uVar207 != 0) * (uVar207 < 0x100) * (char)uVar207 -
                                         (0xff < uVar207),
                                         CONCAT14((uVar203 != 0) * (uVar203 < 0x100) * (char)uVar203
                                                  - (0xff < uVar203),
                                                  CONCAT13((uVar200 != 0) * (uVar200 < 0x100) *
                                                           (char)uVar200 - (0xff < uVar200),
                                                           CONCAT12((uVar197 != 0) *
                                                                    (uVar197 < 0x100) *
                                                                    (char)uVar197 - (0xff < uVar197)
                                                                    ,CONCAT11((uVar194 != 0) *
                                                                              (uVar194 < 0x100) *
                                                                              (char)uVar194 -
                                                                              (0xff < uVar194),
                                                                              (uVar191 != 0) *
                                                                              (uVar191 < 0x100) *
                                                                              (char)uVar191 -
                                                                              (0xff < uVar191)))))))
                      ) & auVar236._0_8_ | ~auVar236._0_8_ & uVar251;
    uVar191 = (ushort)(((uVar223 * 3 + uVar225) - sVar201) + (sVar249 - sVar186)) >> 3;
    uVar194 = (ushort)(((sVar171 * 3 + sVar180) - sVar205) + (sVar255 - sVar187)) >> 3;
    uVar197 = (ushort)(((sVar172 * 3 + sVar182) - sVar209) + (sVar262 - sVar188)) >> 3;
    uVar200 = (ushort)(((sVar173 * 3 + sVar184) - (uVar162 >> 8)) + sVar269) >> 3;
    uVar203 = (ushort)(((sVar174 * 3 + sVar186) - uVar177) + (sVar249 - uVar225)) >> 3;
    uVar207 = (ushort)(((sVar175 * 3 + sVar187) - sVar192) + (sVar255 - sVar180)) >> 3;
    uVar211 = (ushort)(((sVar176 * 3 + sVar188) - sVar195) + (sVar262 - sVar182)) >> 3;
    uVar215 = (ushort)((((uVar189 >> 8) * 3 + (uVar168 >> 8)) - sVar198) + (sVar268 - sVar184)) >> 3
    ;
    auVar219 = auVar219 & auVar236;
    auVar134._0_8_ =
         CONCAT17((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215),
                  CONCAT16((uVar211 != 0) * (uVar211 < 0x100) * (char)uVar211 - (0xff < uVar211),
                           CONCAT15((uVar207 != 0) * (uVar207 < 0x100) * (char)uVar207 -
                                    (0xff < uVar207),
                                    CONCAT14((uVar203 != 0) * (uVar203 < 0x100) * (char)uVar203 -
                                             (0xff < uVar203),
                                             CONCAT13((uVar200 != 0) * (uVar200 < 0x100) *
                                                      (char)uVar200 - (0xff < uVar200),
                                                      CONCAT12((uVar197 != 0) * (uVar197 < 0x100) *
                                                               (char)uVar197 - (0xff < uVar197),
                                                               CONCAT11((uVar194 != 0) *
                                                                        (uVar194 < 0x100) *
                                                                        (char)uVar194 -
                                                                        (0xff < uVar194),
                                                                        (uVar191 != 0) *
                                                                        (uVar191 < 0x100) *
                                                                        (char)uVar191 -
                                                                        (0xff < uVar191)))))))) &
         auVar236._0_8_ | ~auVar236._0_8_ & auVar134._0_8_;
    uVar229 = CONCAT44(auVar219._0_4_,auVar219._0_4_);
    auVar289[0] = -(auVar219[0] == '\0');
    auVar289[1] = -(auVar219[1] == '\0');
    auVar289[2] = -(auVar219[2] == '\0');
    auVar289[3] = -(auVar219[3] == '\0');
    auVar289[4] = -(auVar219[0] == '\0');
    auVar289[5] = -(auVar219[1] == '\0');
    auVar289[6] = -(auVar219[2] == '\0');
    auVar289[7] = -(auVar219[3] == '\0');
    auVar289[8] = -(auVar219[4] == '\0');
    auVar289[9] = -(auVar219[5] == '\0');
    auVar289[10] = -(auVar219[6] == '\0');
    auVar289[0xb] = -(auVar219[7] == '\0');
    auVar289[0xc] = -(auVar219[4] == '\0');
    auVar289[0xd] = -(auVar219[5] == '\0');
    auVar289[0xe] = -(auVar219[6] == '\0');
    auVar289[0xf] = -(auVar219[7] == '\0');
    uVar102 = auVar138._0_8_;
    if ((ushort)((ushort)(SUB161(auVar289 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar289 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar289 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar289 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar289 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar289 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar289 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar289 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar289 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar289 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar289 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar289 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar289 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar289 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar289 >> 0x77,0) & 1) << 0xe |
                (ushort)(auVar289[0xf] >> 7) << 0xf) != 0xffff) {
      auVar17._8_6_ = 0;
      auVar17._0_8_ = local_108._0_8_;
      auVar17[0xe] = (char)((uint)uVar264 >> 0x18);
      auVar24._8_4_ = 0;
      auVar24._0_8_ = local_108._0_8_;
      auVar24[0xc] = (char)((uint)uVar264 >> 0x10);
      auVar24._13_2_ = auVar17._13_2_;
      auVar31._8_4_ = 0;
      auVar31._0_8_ = local_108._0_8_;
      auVar31._12_3_ = auVar24._12_3_;
      auVar38._8_2_ = 0;
      auVar38._0_8_ = local_108._0_8_;
      auVar38[10] = (char)((uint)uVar264 >> 8);
      auVar38._11_4_ = auVar31._11_4_;
      auVar45._8_2_ = 0;
      auVar45._0_8_ = local_108._0_8_;
      auVar45._10_5_ = auVar38._10_5_;
      auVar52[8] = (char)uVar264;
      auVar52._0_8_ = local_108._0_8_;
      auVar52._9_6_ = auVar45._9_6_;
      auVar87._7_8_ = 0;
      auVar87._0_7_ = auVar52._8_7_;
      Var76 = CONCAT81(SUB158(auVar87 << 0x40,7),(char)((uint)uVar250 >> 0x18));
      auVar97._9_6_ = 0;
      auVar97._0_9_ = Var76;
      auVar88._1_10_ = SUB1510(auVar97 << 0x30,5);
      auVar88[0] = (char)((uint)uVar250 >> 0x10);
      auVar98._11_4_ = 0;
      auVar98._0_11_ = auVar88;
      auVar64[2] = (char)((uint)uVar250 >> 8);
      auVar64._0_2_ = (ushort)uVar250;
      auVar64._3_12_ = SUB1512(auVar98 << 0x20,3);
      auVar288._0_2_ = (ushort)uVar250 & 0xff;
      auVar288._2_13_ = auVar64._2_13_;
      auVar288[0xf] = 0;
      auVar18._8_6_ = 0;
      auVar18._0_8_ = auVar138._0_8_;
      auVar18[0xe] = uVar155;
      uVar191 = auVar18._13_2_;
      auVar25._8_4_ = 0;
      auVar25._0_8_ = auVar138._0_8_;
      auVar25[0xc] = uVar154;
      auVar25._13_2_ = uVar191;
      auVar32._8_4_ = 0;
      auVar32._0_8_ = auVar138._0_8_;
      auVar32._12_3_ = auVar25._12_3_;
      auVar39._8_2_ = 0;
      auVar39._0_8_ = auVar138._0_8_;
      auVar39[10] = uVar153;
      auVar39._11_4_ = auVar32._11_4_;
      auVar46._8_2_ = 0;
      auVar46._0_8_ = auVar138._0_8_;
      auVar46._10_5_ = auVar39._10_5_;
      auVar53[8] = (char)uVar11;
      auVar53._0_8_ = auVar138._0_8_;
      auVar53._9_6_ = auVar46._9_6_;
      auVar89._7_8_ = 0;
      auVar89._0_7_ = auVar53._8_7_;
      Var79 = CONCAT81(SUB158(auVar89 << 0x40,7),uVar152);
      auVar99._9_6_ = 0;
      auVar99._0_9_ = Var79;
      auVar90._1_10_ = SUB1510(auVar99 << 0x30,5);
      auVar90[0] = uVar151;
      auVar100._11_4_ = 0;
      auVar100._0_11_ = auVar90;
      auVar65[2] = uVar150;
      auVar65._0_2_ = (ushort)uVar1;
      auVar65._3_12_ = SUB1512(auVar100 << 0x20,3);
      uVar217 = (ushort)uVar1 & 0xff;
      auVar19._8_6_ = 0;
      auVar19._0_8_ = auVar287._0_8_;
      auVar19[0xe] = (char)((uint)uVar160 >> 0x18);
      uVar194 = auVar19._13_2_;
      auVar26._8_4_ = 0;
      auVar26._0_8_ = auVar287._0_8_;
      auVar26[0xc] = (char)((uint)uVar160 >> 0x10);
      auVar26._13_2_ = uVar194;
      auVar33._8_4_ = 0;
      auVar33._0_8_ = auVar287._0_8_;
      auVar33._12_3_ = auVar26._12_3_;
      auVar40._8_2_ = 0;
      auVar40._0_8_ = auVar287._0_8_;
      auVar40[10] = (char)((uint)uVar160 >> 8);
      auVar40._11_4_ = auVar33._11_4_;
      auVar47._8_2_ = 0;
      auVar47._0_8_ = auVar287._0_8_;
      auVar47._10_5_ = auVar40._10_5_;
      auVar54[8] = (char)uVar160;
      auVar54._0_8_ = auVar287._0_8_;
      auVar54._9_6_ = auVar47._9_6_;
      auVar91._7_8_ = 0;
      auVar91._0_7_ = auVar54._8_7_;
      Var82 = CONCAT81(SUB158(auVar91 << 0x40,7),(char)((uint)uVar8 >> 0x18));
      auVar101._9_6_ = 0;
      auVar101._0_9_ = Var82;
      auVar59[4] = (char)((uint)uVar8 >> 0x10);
      auVar59._0_4_ = uVar8;
      auVar59._5_10_ = SUB1510(auVar101 << 0x30,5);
      auVar92._11_4_ = 0;
      auVar92._0_11_ = auVar59._4_11_;
      auVar66[2] = (char)((uint)uVar8 >> 8);
      auVar66._0_2_ = (ushort)uVar8;
      auVar66._3_12_ = SUB1512(auVar92 << 0x20,3);
      uVar200 = (ushort)uVar8 & 0xff;
      local_118 = ~uVar229 & auVar166._0_8_;
      sVar256 = auVar64._2_2_;
      sVar263 = auVar88._0_2_;
      sVar270 = (short)Var76;
      sVar273 = auVar52._8_2_;
      sVar276 = auVar38._10_2_;
      sVar280 = auVar24._12_2_;
      uVar197 = auVar17._13_2_ >> 8;
      sVar220 = auVar65._2_2_;
      sVar221 = auVar90._0_2_;
      sVar222 = (short)Var79;
      sVar224 = auVar53._8_2_;
      sVar226 = auVar39._10_2_;
      sVar227 = auVar25._12_2_;
      sVar167 = (uVar189 >> 8) + (uVar191 >> 8);
      sVar290 = uVar223 + uVar217 + uVar200;
      sVar158 = auVar66._2_2_;
      sVar291 = sVar171 + sVar220 + sVar158;
      sVar159 = auVar59._4_2_;
      sVar293 = sVar172 + sVar221 + sVar159;
      sVar161 = (short)Var82;
      sVar295 = sVar173 + sVar222 + sVar161;
      sVar163 = auVar54._8_2_;
      sVar298 = sVar174 + sVar224 + sVar163;
      sVar164 = auVar40._10_2_;
      sVar301 = sVar175 + sVar226 + sVar164;
      sVar165 = auVar26._12_2_;
      sVar304 = sVar176 + sVar227 + sVar165;
      sVar307 = sVar167 + (uVar194 >> 8);
      sVar179 = sVar202 + sVar298 + sVar190 + sVar290 + 8;
      sVar181 = sVar206 + sVar301 + sVar193 + sVar291 + 8;
      sVar183 = sVar210 + sVar304 + sVar196 + sVar293 + 8;
      sVar185 = sVar214 + sVar307 + sVar199 + sVar295 + 8;
      sVar243 = sVar185 - (uVar194 >> 8);
      sVar249 = (sVar179 - uVar200) - uVar217;
      sVar268 = (sVar181 - sVar158) - sVar220;
      sVar117 = (sVar183 - sVar159) - sVar221;
      sVar123 = (sVar185 - sVar161) - sVar222;
      sVar231 = (sVar179 - sVar163) - sVar224;
      sVar237 = (sVar181 - sVar164) - sVar226;
      sVar240 = (sVar183 - sVar165) - sVar227;
      sVar244 = sVar243 - (uVar191 >> 8);
      sVar232 = sVar231 - sVar174;
      sVar238 = sVar237 - sVar175;
      sVar241 = sVar240 - sVar176;
      sVar245 = sVar244 - (uVar189 >> 8);
      sVar255 = sVar249 - uVar223;
      sVar269 = sVar268 - sVar171;
      sVar118 = sVar117 - sVar172;
      sVar124 = sVar123 - sVar173;
      auVar105 = psllw(auVar288,2);
      sVar233 = sVar232 - sVar186;
      sVar239 = sVar238 - sVar187;
      sVar242 = sVar241 - sVar188;
      sVar246 = sVar245 - (uVar168 >> 8);
      sVar262 = sVar255 - uVar225;
      sVar112 = sVar269 - sVar180;
      sVar119 = sVar118 - sVar182;
      sVar125 = sVar124 - sVar184;
      uVar203 = (ushort)(sVar128 + sVar179 + uVar204 + uVar177 + auVar288._0_2_) >> 4;
      uVar207 = (ushort)(sVar131 + sVar181 + sVar111 + sVar192 + sVar256) >> 4;
      uVar211 = (ushort)(sVar133 + sVar183 + sVar116 + sVar195 + sVar263) >> 4;
      uVar215 = (ushort)((uVar216 >> 8) + sVar185 + sVar122 + sVar198 + sVar270) >> 4;
      uVar204 = (ushort)(sVar179 + uVar204 + sVar128 + sVar201 + sVar273) >> 4;
      uVar208 = (ushort)(sVar181 + sVar111 + sVar131 + sVar205 + sVar276) >> 4;
      uVar212 = (ushort)(sVar183 + sVar116 + sVar133 + sVar209 + sVar280) >> 4;
      uVar216 = (ushort)(sVar185 + sVar122 + (uVar216 >> 8) + (uVar162 >> 8) + uVar197) >> 4;
      uVar135 = CONCAT17((uVar216 != 0) * (uVar216 < 0x100) * (char)uVar216 - (0xff < uVar216),
                         CONCAT16((uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 -
                                  (0xff < uVar212),
                                  CONCAT15((uVar208 != 0) * (uVar208 < 0x100) * (char)uVar208 -
                                           (0xff < uVar208),
                                           CONCAT14((uVar204 != 0) * (uVar204 < 0x100) *
                                                    (char)uVar204 - (0xff < uVar204),
                                                    CONCAT13((uVar215 != 0) * (uVar215 < 0x100) *
                                                             (char)uVar215 - (0xff < uVar215),
                                                             CONCAT12((uVar211 != 0) *
                                                                      (uVar211 < 0x100) *
                                                                      (char)uVar211 -
                                                                      (0xff < uVar211),
                                                                      CONCAT11((uVar207 != 0) *
                                                                               (uVar207 < 0x100) *
                                                                               (char)uVar207 -
                                                                               (0xff < uVar207),
                                                                               (uVar203 != 0) *
                                                                               (uVar203 < 0x100) *
                                                                               (char)uVar203 -
                                                                               (0xff < uVar203))))))
                                 )) & uVar229 | ~uVar229 & uVar135;
      uVar216 = (ushort)(auVar288._0_2_ * 2 + sVar190 + (sVar179 - sVar163)) >> 4;
      uVar204 = (ushort)(sVar256 * 2 + sVar193 + (sVar181 - sVar164)) >> 4;
      uVar203 = (ushort)(sVar263 * 2 + sVar196 + (sVar183 - sVar165)) >> 4;
      uVar207 = (ushort)(sVar270 * 2 + sVar199 + sVar243) >> 4;
      uVar211 = (ushort)((sVar179 - uVar200) + sVar273 * 2 + sVar202) >> 4;
      uVar215 = (ushort)((sVar181 - sVar158) + sVar276 * 2 + sVar206) >> 4;
      uVar208 = (ushort)((sVar183 - sVar159) + sVar280 * 2 + sVar210) >> 4;
      uVar212 = (ushort)((sVar185 - sVar161) + uVar197 * 2 + sVar214) >> 4;
      uVar251 = CONCAT17((uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 - (0xff < uVar212),
                         CONCAT16((uVar208 != 0) * (uVar208 < 0x100) * (char)uVar208 -
                                  (0xff < uVar208),
                                  CONCAT15((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 -
                                           (0xff < uVar215),
                                           CONCAT14((uVar211 != 0) * (uVar211 < 0x100) *
                                                    (char)uVar211 - (0xff < uVar211),
                                                    CONCAT13((uVar207 != 0) * (uVar207 < 0x100) *
                                                             (char)uVar207 - (0xff < uVar207),
                                                             CONCAT12((uVar203 != 0) *
                                                                      (uVar203 < 0x100) *
                                                                      (char)uVar203 -
                                                                      (0xff < uVar203),
                                                                      CONCAT11((uVar204 != 0) *
                                                                               (uVar204 < 0x100) *
                                                                               (char)uVar204 -
                                                                               (0xff < uVar204),
                                                                               (uVar216 != 0) *
                                                                               (uVar216 < 0x100) *
                                                                               (char)uVar216 -
                                                                               (0xff < uVar216))))))
                                 )) & uVar229 | ~uVar229 & uVar251;
      uVar216 = (ushort)(uVar177 + uVar225 + uVar223 + auVar288._0_2_ * 3 + sVar231) >> 4;
      uVar204 = (ushort)(sVar192 + sVar180 + sVar171 + sVar256 * 3 + sVar237) >> 4;
      uVar203 = (ushort)(sVar195 + sVar182 + sVar172 + sVar263 * 3 + sVar240) >> 4;
      uVar207 = (ushort)(sVar198 + sVar184 + sVar173 + sVar270 * 3 + sVar244) >> 4;
      uVar211 = (ushort)(sVar249 + sVar201 + sVar186 + sVar174 + sVar273 * 3) >> 4;
      uVar215 = (ushort)(sVar268 + sVar205 + sVar187 + sVar175 + sVar276 * 3) >> 4;
      uVar208 = (ushort)(sVar117 + sVar209 + sVar188 + sVar176 + sVar280 * 3) >> 4;
      uVar189 = (ushort)(sVar123 + sVar213 + (uVar189 >> 8) + uVar197 * 3) >> 4;
      auVar134._0_8_ =
           CONCAT17((uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 - (0xff < uVar189),
                    CONCAT16((uVar208 != 0) * (uVar208 < 0x100) * (char)uVar208 - (0xff < uVar208),
                             CONCAT15((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 -
                                      (0xff < uVar215),
                                      CONCAT14((uVar211 != 0) * (uVar211 < 0x100) * (char)uVar211 -
                                               (0xff < uVar211),
                                               CONCAT13((uVar207 != 0) * (uVar207 < 0x100) *
                                                        (char)uVar207 - (0xff < uVar207),
                                                        CONCAT12((uVar203 != 0) * (uVar203 < 0x100)
                                                                 * (char)uVar203 - (0xff < uVar203),
                                                                 CONCAT11((uVar204 != 0) *
                                                                          (uVar204 < 0x100) *
                                                                          (char)uVar204 -
                                                                          (0xff < uVar204),
                                                                          (uVar216 != 0) *
                                                                          (uVar216 < 0x100) *
                                                                          (char)uVar216 -
                                                                          (0xff < uVar216)))))))) &
           uVar229 | ~uVar229 & auVar134._0_8_;
      uVar216 = (ushort)(uVar223 + uVar217 + uVar225 + auVar105._0_2_ + sVar232) >> 4;
      uVar189 = (ushort)(sVar171 + sVar220 + sVar180 + auVar105._2_2_ + sVar238) >> 4;
      uVar204 = (ushort)(sVar172 + sVar221 + sVar182 + auVar105._4_2_ + sVar241) >> 4;
      uVar203 = (ushort)(sVar173 + sVar222 + sVar184 + auVar105._6_2_ + sVar245) >> 4;
      uVar207 = (ushort)(sVar255 + sVar174 + sVar224 + sVar186 + auVar105._8_2_) >> 4;
      uVar211 = (ushort)(sVar269 + sVar175 + sVar226 + sVar187 + auVar105._10_2_) >> 4;
      uVar215 = (ushort)(sVar118 + sVar176 + sVar227 + sVar188 + auVar105._12_2_) >> 4;
      uVar168 = (ushort)(sVar124 + sVar167 + (uVar168 >> 8) + auVar105._14_2_) >> 4;
      auVar166._0_8_ =
           CONCAT17((uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168),
                    CONCAT16((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215),
                             CONCAT15((uVar211 != 0) * (uVar211 < 0x100) * (char)uVar211 -
                                      (0xff < uVar211),
                                      CONCAT14((uVar207 != 0) * (uVar207 < 0x100) * (char)uVar207 -
                                               (0xff < uVar207),
                                               CONCAT13((uVar203 != 0) * (uVar203 < 0x100) *
                                                        (char)uVar203 - (0xff < uVar203),
                                                        CONCAT12((uVar204 != 0) * (uVar204 < 0x100)
                                                                 * (char)uVar204 - (0xff < uVar204),
                                                                 CONCAT11((uVar189 != 0) *
                                                                          (uVar189 < 0x100) *
                                                                          (char)uVar189 -
                                                                          (0xff < uVar189),
                                                                          (uVar216 != 0) *
                                                                          (uVar216 < 0x100) *
                                                                          (char)uVar216 -
                                                                          (0xff < uVar216)))))))) &
           uVar229 | local_118;
      uVar207 = (ushort)(auVar288._0_2_ * 5 + sVar290 + sVar233) >> 4;
      uVar211 = (ushort)(sVar256 * 5 + sVar291 + sVar239) >> 4;
      uVar215 = (ushort)(sVar263 * 5 + sVar293 + sVar242) >> 4;
      uVar223 = (ushort)(sVar270 * 5 + sVar295 + sVar246) >> 4;
      uVar225 = (ushort)(sVar262 + sVar273 * 5 + sVar298) >> 4;
      uVar208 = (ushort)(sVar112 + sVar276 * 5 + sVar301) >> 4;
      uVar212 = (ushort)(sVar119 + sVar280 * 5 + sVar304) >> 4;
      uVar228 = (ushort)(sVar125 + uVar197 * 5 + sVar307) >> 4;
      uVar216 = (ushort)(uVar200 + uVar217 + auVar288._0_2_ * 7 + (sVar233 - sVar201)) >> 4;
      uVar168 = (ushort)(sVar158 + sVar220 + sVar256 * 7 + (sVar239 - sVar205)) >> 4;
      uVar189 = (ushort)(sVar159 + sVar221 + sVar263 * 7 + (sVar242 - sVar209)) >> 4;
      uVar162 = (ushort)(sVar161 + sVar222 + sVar270 * 7 + (sVar246 - (uVar162 >> 8))) >> 4;
      uVar204 = (ushort)(sVar163 + sVar224 + sVar273 * 7 + (sVar262 - uVar177)) >> 4;
      uVar200 = (ushort)(sVar164 + sVar226 + sVar276 * 7 + (sVar112 - sVar192)) >> 4;
      uVar203 = (ushort)(sVar165 + sVar227 + sVar280 * 7 + (sVar119 - sVar195)) >> 4;
      uVar191 = (ushort)((uVar194 >> 8) + (uVar191 >> 8) + uVar197 * 7 + (sVar125 - sVar198)) >> 4;
      auVar287._0_8_ =
           ~uVar229 & auVar287._0_8_ |
           CONCAT17((uVar191 != 0) * (uVar191 < 0x100) * (char)uVar191 - (0xff < uVar191),
                    CONCAT16((uVar203 != 0) * (uVar203 < 0x100) * (char)uVar203 - (0xff < uVar203),
                             CONCAT15((uVar200 != 0) * (uVar200 < 0x100) * (char)uVar200 -
                                      (0xff < uVar200),
                                      CONCAT14((uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 -
                                               (0xff < uVar204),
                                               CONCAT13((uVar162 != 0) * (uVar162 < 0x100) *
                                                        (char)uVar162 - (0xff < uVar162),
                                                        CONCAT12((uVar189 != 0) * (uVar189 < 0x100)
                                                                 * (char)uVar189 - (0xff < uVar189),
                                                                 CONCAT11((uVar168 != 0) *
                                                                          (uVar168 < 0x100) *
                                                                          (char)uVar168 -
                                                                          (0xff < uVar168),
                                                                          (uVar216 != 0) *
                                                                          (uVar216 < 0x100) *
                                                                          (char)uVar216 -
                                                                          (0xff < uVar216)))))))) &
           uVar229;
      uVar102 = CONCAT17((uVar228 != 0) * (uVar228 < 0x100) * (char)uVar228 - (0xff < uVar228),
                         CONCAT16((uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 -
                                  (0xff < uVar212),
                                  CONCAT15((uVar208 != 0) * (uVar208 < 0x100) * (char)uVar208 -
                                           (0xff < uVar208),
                                           CONCAT14((uVar225 != 0) * (uVar225 < 0x100) *
                                                    (char)uVar225 - (0xff < uVar225),
                                                    CONCAT13((uVar223 != 0) * (uVar223 < 0x100) *
                                                             (char)uVar223 - (0xff < uVar223),
                                                             CONCAT12((uVar215 != 0) *
                                                                      (uVar215 < 0x100) *
                                                                      (char)uVar215 -
                                                                      (0xff < uVar215),
                                                                      CONCAT11((uVar211 != 0) *
                                                                               (uVar211 < 0x100) *
                                                                               (char)uVar211 -
                                                                               (0xff < uVar211),
                                                                               (uVar207 != 0) *
                                                                               (uVar207 < 0x100) *
                                                                               (char)uVar207 -
                                                                               (0xff < uVar207))))))
                                 )) & uVar229 | ~uVar229 & auVar138._0_8_;
    }
  }
  local_128._0_8_ = uVar102;
  *(int *)(s + -lVar103) = (int)uVar135;
  *(int *)s = (int)(uVar135 >> 0x20);
  *(int *)(s + lVar103 * -2) = (int)uVar251;
  *(int *)(s + lVar103) = (int)(uVar251 >> 0x20);
  *(int *)(s + lVar103 * -3) = (int)auVar134._0_8_;
  *(int *)(s + lVar103 * 2) = (int)(auVar134._0_8_ >> 0x20);
  *(int *)(s + lVar103 * -4) = (int)auVar166._0_8_;
  *(int *)(s + lVar103 * 3) = (int)(auVar166._0_8_ >> 0x20);
  *(undefined4 *)(s + lVar103 * -5) = local_128._0_4_;
  *(undefined4 *)(s + lVar103 * 4) = local_128._4_4_;
  *(int *)(s + lVar103 * -6) = (int)auVar287._0_8_;
  *(int *)(s + lVar103 * 5) = (int)(auVar287._0_8_ >> 0x20);
  return;
}

Assistant:

void aom_lpf_horizontal_14_sse2(unsigned char *s, int p,
                                const unsigned char *_blimit,
                                const unsigned char *_limit,
                                const unsigned char *_thresh) {
  __m128i q6p6, q5p5, q4p4, q3p3, q2p2, q1p1, q0p0;
  __m128i blimit = _mm_load_si128((const __m128i *)_blimit);
  __m128i limit = _mm_load_si128((const __m128i *)_limit);
  __m128i thresh = _mm_load_si128((const __m128i *)_thresh);

  q4p4 = _mm_unpacklo_epi32(xx_loadl_32(s - 5 * p), xx_loadl_32(s + 4 * p));
  q3p3 = _mm_unpacklo_epi32(xx_loadl_32(s - 4 * p), xx_loadl_32(s + 3 * p));
  q2p2 = _mm_unpacklo_epi32(xx_loadl_32(s - 3 * p), xx_loadl_32(s + 2 * p));
  q1p1 = _mm_unpacklo_epi32(xx_loadl_32(s - 2 * p), xx_loadl_32(s + 1 * p));

  q0p0 = _mm_unpacklo_epi32(xx_loadl_32(s - 1 * p), xx_loadl_32(s - 0 * p));

  q5p5 = _mm_unpacklo_epi32(xx_loadl_32(s - 6 * p), xx_loadl_32(s + 5 * p));

  q6p6 = _mm_unpacklo_epi32(xx_loadl_32(s - 7 * p), xx_loadl_32(s + 6 * p));

  lpf_internal_14_sse2(&q6p6, &q5p5, &q4p4, &q3p3, &q2p2, &q1p1, &q0p0, &blimit,
                       &limit, &thresh);

  store_buffer_horz_8(q0p0, p, 0, s);
  store_buffer_horz_8(q1p1, p, 1, s);
  store_buffer_horz_8(q2p2, p, 2, s);
  store_buffer_horz_8(q3p3, p, 3, s);
  store_buffer_horz_8(q4p4, p, 4, s);
  store_buffer_horz_8(q5p5, p, 5, s);
}